

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaL_register(lua_State *L,char *libname,luaL_Reg *l)

{
  undefined8 in_RDX;
  luaL_Reg *in_RSI;
  char *in_RDI;
  
  luaI_openlib((lua_State *)l,in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  return;
}

Assistant:

static void luaL_register(lua_State*L,const char*libname,
const luaL_Reg*l){
luaI_openlib(L,libname,l,0);
}